

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O3

int shm::open(char *__file,int __oflag,...)

{
  int __fd;
  int iVar1;
  void *pvVar2;
  int *piVar3;
  char *pcVar4;
  ostream *poVar5;
  SHMException *pSVar6;
  shm_key_t *key;
  stringstream ss;
  stat st;
  string local_250;
  stringstream local_230 [16];
  ostream local_220 [376];
  stat local_a8;
  
  key = (shm_key_t *)0x42;
  __fd = shm_open(__file,0x42,0);
  if (__fd == -1) {
    open::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)__file,key);
  }
  else {
    memset(&local_a8,0,0x90);
    iVar1 = fstat(__fd,&local_a8);
    if (iVar1 == 0) {
      pvVar2 = mmap((void *)0x0,local_a8.st_size,3,1,__fd,0);
      if (pvVar2 != (void *)0xffffffffffffffff) {
        ::close(__fd);
        return (int)pvVar2;
      }
      std::__cxx11::stringstream::stringstream(local_230);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_220,"Failed to mmap shm region with the following error: ",0x34);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar5 = std::operator<<(local_220,pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,"unlinking.",10);
      shm_unlink(__file);
      pSVar6 = (SHMException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      SHMException::SHMException(pSVar6,&local_250);
      *(undefined ***)pSVar6 = &PTR__SHMException_00106c88;
      __cxa_throw(pSVar6,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
    }
  }
  std::__cxx11::stringstream::stringstream(local_230);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_220,"Failed to stat shm region with the following error: ",0x34);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  poVar5 = std::operator<<(local_220,pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_220,"unlinking.",10);
  shm_unlink(__file);
  pSVar6 = (SHMException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  SHMException::SHMException(pSVar6,&local_250);
  *(undefined ***)pSVar6 = &PTR__SHMException_00106c88;
  __cxa_throw(pSVar6,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
}

Assistant:

void*
shm::open( const shm_key_t &key )
{
   /**
    * just like with init, use same output
    * pointer stack location for both. 
    */
   void *out( nullptr );
    
    auto handle_open_failure = [&]( const shm_key_t &key ) -> void*
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
        ss << 
            "Failed to open shm with key \"" << key << "\", with the following error code (";
        ss << std::strerror( errno ) << ")"; 
        throw bad_shm_alloc( ss.str() );
#else
        return( nullptr );
#endif

    };
#if _USE_POSIX_SHM_ == 1
   int fd( shm::failure );
   const int flags( O_RDWR | O_CREAT );
   mode_t mode( 0 );
   fd = shm_open( key, 
                  flags, 
                  mode ); 
   if( fd == failure )
   {
        return( handle_open_failure( key ) );
   }
   struct stat st;
   std::memset( &st, 
                0x0, 
                sizeof( struct stat ) );
   /* stat the file to get the size */
   if( fstat( fd, &st ) != shm::success )
   {
#if USE_CPP_EXCEPTIONS==1      
      std::stringstream ss;
      ss << "Failed to stat shm region with the following error: " << std::strerror( errno ) << ",\n";
      ss << "unlinking.";
      shm_unlink( key );
      throw bad_shm_alloc( ss.str() );
#else
      shm_unlink( key );
      return( nullptr );
#endif
   }
   out = mmap( nullptr, 
               st.st_size, 
               (PROT_READ | PROT_WRITE), 
               MAP_SHARED, 
               fd, 
               0 );
   if( out == MAP_FAILED )
   {
#if USE_CPP_EXCEPTIONS==1      
      std::stringstream ss;
      ss << "Failed to mmap shm region with the following error: " << std::strerror( errno ) << ",\n";
      ss << "unlinking.";
      shm_unlink( key );
      throw bad_shm_alloc( ss.str() );
#else
      shm_unlink( key );
      return( nullptr );
#endif
   }
   /* close fd */
   ::close( fd );
   /* done, return mem */
   return( out );

/** END POSIX MEMORY **/
#elif _USE_SYSTEMV_SHM_ == 1
/** START SYSTEMV MEMORY **/

//STEP1 shmget
    const auto shmid = 
        shmget( key, sizeof(int), S_IRUSR | S_IWUSR );
    if( shmid == shm::failure ) 
    {
        //if using exceptions, you won't return from this
        return( handle_open_failure( key ) );
    }
//STEP2 shmat
    out = shmat(shmid, nullptr, 0);
    if( out == (void*)-1 ) 
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
        ss << "Failed to SHM attach the shm region with the following error (" 
            <<  std::strerror( errno ) << ").";
        throw bad_shm_alloc( ss.str() );
#else
        return( nullptr );
#endif
    }
/** END SYSTEMV MEMORY **/
#endif
    //if we're here, everything theoretically worked
    return( out );
}